

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O3

void __thiscall wasm::Flatten::visitExpression(Flatten *this,Expression *curr)

{
  ExpressionList *pEVar1;
  Id IVar2;
  uintptr_t uVar3;
  pointer ppEVar4;
  undefined8 *puVar5;
  iterator __position;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  iterator iVar13;
  bool bVar14;
  Index IVar15;
  int iVar16;
  Id IVar17;
  Try *pTVar18;
  LocalSet *pLVar19;
  Try *pTVar20;
  iterator iVar21;
  Expression *pEVar22;
  Expression *pEVar23;
  _Rb_tree_node_base *p_Var24;
  undefined4 extraout_var;
  __node_base_ptr p_Var25;
  Expression **ppEVar26;
  Type TVar27;
  Expression *pEVar28;
  ulong uVar29;
  mapped_type *pmVar30;
  vector<wasm::Expression*,std::allocator<wasm::Expression*>> *this_00;
  ulong uVar31;
  uintptr_t uVar32;
  Expression *expr;
  uint uVar33;
  Flatten *pFVar34;
  MixedArena *pMVar35;
  int *piVar36;
  Type in_R8;
  undefined8 *puVar37;
  Type type;
  ulong uVar38;
  MixedArena *pMVar39;
  Iterator __first;
  Iterator __last;
  undefined1 auStack_b8 [8];
  Expression *prelude;
  undefined8 local_a8;
  _Rb_tree_node_base *local_a0;
  Try *local_80;
  Expression *curr_local;
  iterator iStack_70;
  pointer local_68;
  Try *local_58;
  Expression *item;
  Flatten *local_48;
  Try *local_40;
  Builder local_38;
  Builder builder;
  
  curr_local = (Expression *)0x0;
  iStack_70._M_current = (Expression **)0x0;
  local_68 = (pointer)0x0;
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
       ).
       super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
       .super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.
       super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.currModule;
  IVar17 = curr->_id;
  IVar2 = IVar17;
  pEVar23 = curr;
  while (IVar2 == RefAsId) {
    if (1 < pEVar23[1]._id - BlockId) goto LAB_006ee504;
    pEVar23 = (Expression *)pEVar23[1].type.id;
    IVar2 = pEVar23->_id;
  }
  if ((IVar2 - ConstId < 0x3d) &&
     ((0x1000000028000001U >> ((ulong)(IVar2 - ConstId) & 0x3f) & 1) != 0)) {
    return;
  }
LAB_006ee504:
  item = (Expression *)
         &(this->
          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
          ).
          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
  ;
  local_80 = (Try *)curr;
  local_48 = this;
  if ((int)IVar17 < 0x16) {
    if (2 < IVar17 - BlockId) {
LAB_006ee88c:
      iVar21 = std::
               _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->preludes)._M_h,(key_type *)&local_80);
      pFVar34 = local_48;
      pTVar20 = local_80;
      if (iVar21.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        pEVar23 = *(Expression **)
                   ((long)iVar21.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                          ._M_cur + 0x10);
        ppEVar26 = *(Expression ***)
                    ((long)iVar21.
                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                           ._M_cur + 0x18);
        ppEVar4 = *(pointer *)
                   ((long)iVar21.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                          ._M_cur + 0x20);
        *(Expression **)
         ((long)iVar21.
                super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                ._M_cur + 0x10) = curr_local;
        *(Expression ***)
         ((long)iVar21.
                super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                ._M_cur + 0x18) = iStack_70._M_current;
        *(pointer *)
         ((long)iVar21.
                super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                ._M_cur + 0x20) = local_68;
        curr_local = pEVar23;
        iStack_70._M_current = ppEVar26;
        local_68 = ppEVar4;
      }
      IVar17 = (((SpecificExpression<(wasm::Expression::Id)5> *)
                &local_80->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression).
               _id;
      if (IVar17 == BreakId) {
        pMVar35 = (MixedArena *)local_80->body;
        if (pMVar35 == (MixedArena *)0x0) goto LAB_006eefb5;
        uVar29 = ((Type *)&(pMVar35->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->id;
        if (1 < uVar29) {
          pEVar23 = ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                    ::findBreakTarget((ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       *)item,(IString)*(IString *)
                                                        &((ArenaVector<wasm::Name> *)&local_80->name
                                                         )->
                                                  super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>
                                     );
          TVar27.id = (pEVar23->type).id;
          IVar17 = getTempForBreakTarget
                             (local_48,(IString)*(IString *)
                                                 &((ArenaVector<wasm::Name> *)&pTVar20->name)->
                                                  super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>
                              ,TVar27);
          auStack_b8 = (undefined1  [8])Builder::makeLocalSet(&local_38,IVar17,pTVar20->body);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                     (Expression **)auStack_b8);
          if (uVar29 != TVar27.id) {
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar29;
            IVar17 = Builder::addVar((Builder *)
                                     (local_48->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .currFunction,(Function *)0x0,(Name)(auVar10 << 0x40),in_R8);
            iVar16 = ExpressionManipulator::copy
                               ((EVP_PKEY_CTX *)pTVar20->body,
                                (EVP_PKEY_CTX *)
                                (local_48->
                                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                ).
                                super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                .
                                super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                .
                                super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                .currModule);
            auStack_b8 = (undefined1  [8])
                         Builder::makeLocalSet
                                   (&local_38,IVar17,(Expression *)CONCAT44(extraout_var,iVar16));
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                       (Expression **)auStack_b8);
          }
          if ((MixedArena *)
              (pTVar20->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
              != (MixedArena *)0x0) {
            auStack_b8 = (undefined1  [8])pTVar20;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                       (Expression **)auStack_b8);
            uVar31 = (((SpecificExpression<(wasm::Expression::Id)5> *)
                      &pTVar20->super_SpecificExpression<(wasm::Expression::Id)49>)->
                     super_Expression).type.id;
            if (uVar31 < 2) {
              if (uVar31 != 1) {
                __assert_fail("br->type == Type::unreachable",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                              ,0x128,"void wasm::Flatten::visitExpression(Expression *)");
              }
              pEVar23 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x10,8);
              pEVar23->_id = UnreachableId;
              (pEVar23->type).id = 1;
              Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
              replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              *)item,pEVar23);
            }
            else {
              pEVar23 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
              pEVar23->_id = LocalGetId;
              pEVar23[1]._id = IVar17;
              (pEVar23->type).id = uVar29;
              Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
              replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              *)item,pEVar23);
            }
            ppEVar26 = SmallVector<wasm::Expression_*,_10UL>::back
                                 (&(local_48->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .expressionStack);
            *ppEVar26 = pEVar23;
          }
          pTVar20->body = (Expression *)0x0;
          Break::finalize((Break *)pTVar20);
          goto LAB_006eefb5;
        }
        if (uVar29 != 1) {
          __assert_fail("type == Type::unreachable",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                        ,0x12f,"void wasm::Flatten::visitExpression(Expression *)");
        }
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   item,(Expression *)pMVar35);
      }
      else if (IVar17 == SwitchId) {
        pMVar35 = (local_80->catchTags).allocator;
        if (pMVar35 == (MixedArena *)0x0) goto LAB_006eefb5;
        TVar27.id = ((Type *)&(pMVar35->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish)->id;
        if (1 < TVar27.id) {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = TVar27.id;
          IVar17 = Builder::addVar((Builder *)
                                   (local_48->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .currFunction,(Function *)0x0,(Name)(auVar9 << 0x40),in_R8);
          auStack_b8 = (undefined1  [8])
                       Builder::makeLocalSet
                                 (&local_38,IVar17,(Expression *)(pTVar20->catchTags).allocator);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                     (Expression **)auStack_b8);
          BranchUtils::getUniqueTargets((NameSet *)auStack_b8,(BranchUtils *)pTVar20,expr);
          for (p_Var24 = local_a0; p_Var24 != (_Rb_tree_node_base *)&prelude;
              p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24)) {
            IVar15 = getTempForBreakTarget(local_48,(Name)*(string_view *)(p_Var24 + 1),TVar27);
            pEVar23 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
            pEVar23->_id = LocalGetId;
            pEVar23[1]._id = IVar17;
            (pEVar23->type).id = TVar27.id;
            local_58 = (Try *)Builder::makeLocalSet(&local_38,IVar15,pEVar23);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                       (Expression **)&local_58);
          }
          (pTVar20->catchTags).allocator = (MixedArena *)0x0;
          Switch::finalize((Switch *)pTVar20);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)auStack_b8);
          goto LAB_006eefb5;
        }
        if (TVar27.id != 1) {
          __assert_fail("type == Type::unreachable",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                        ,0x146,"void wasm::Flatten::visitExpression(Expression *)");
        }
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   item,(Expression *)pMVar35);
      }
      else {
        if ((IVar17 != LocalSetId) || (bVar14 = LocalSet::isTee((LocalSet *)local_80), !bVar14))
        goto LAB_006eefb5;
        pMVar35 = (MixedArena *)
                  (((ArenaVector<wasm::Name> *)&pTVar20->name)->
                  super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).usedElements;
        if (((Type *)&(pMVar35->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_finish)->id != 1) {
          LocalSet::makeSet((LocalSet *)pTVar20);
          auStack_b8 = (undefined1  [8])pTVar20;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                     (Expression **)auStack_b8);
          pFVar34 = local_48;
          TVar27 = Function::getLocalType
                             ((local_48->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              .
                              super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              .
                              super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              .currFunction,
                              *(Index *)&(((ArenaVector<wasm::Name> *)&pTVar20->name)->
                                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>)
                                         .data);
          pEVar23 = item;
          IVar17 = *(Id *)&(((ArenaVector<wasm::Name> *)&pTVar20->name)->
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).data;
          pEVar28 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
          pEVar28->_id = LocalGetId;
          pEVar28[1]._id = IVar17;
          (pEVar28->type).id = TVar27.id;
          Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
          replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          *)pEVar23,pEVar28);
          ppEVar26 = SmallVector<wasm::Expression_*,_10UL>::back
                               (&(pFVar34->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .expressionStack);
          *ppEVar26 = pEVar28;
          goto LAB_006eefb5;
        }
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   item,(Expression *)pMVar35);
        pFVar34 = local_48;
      }
      ppEVar26 = SmallVector<wasm::Expression_*,_10UL>::back
                           (&(pFVar34->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             .expressionStack);
      *ppEVar26 = (Expression *)pMVar35;
      goto LAB_006eefb5;
    }
  }
  else {
    if (IVar17 == NopId) {
      return;
    }
    if (IVar17 != TryId) {
      if (IVar17 == TupleMakeId) {
        uVar3 = curr[1].type.id;
        if (uVar3 == 0) {
          return;
        }
        uVar32 = 0;
        while( true ) {
          for (piVar36 = *(int **)(*(long *)(curr + 1) + uVar32 * 8); *piVar36 == 0x48;
              piVar36 = *(int **)(piVar36 + 6)) {
            in_R8.id = (uintptr_t)(piVar36[4] - 1U);
            if (1 < piVar36[4] - 1U) goto LAB_006ee88c;
          }
          uVar33 = *piVar36 - 0xe;
          in_R8.id = (uintptr_t)uVar33;
          if ((0x3c < uVar33) || ((0x1000000028000001U >> (in_R8.id & 0x3f) & 1) == 0)) break;
          uVar32 = uVar32 + 1;
          if (uVar32 == uVar3) {
            return;
          }
        }
      }
      goto LAB_006ee88c;
    }
  }
  iVar21 = std::
           _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->preludes)._M_h,(key_type *)&local_80);
  pTVar20 = local_80;
  if (iVar21.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    __assert_fail("preludes.find(curr) == preludes.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                  ,0x68,"void wasm::Flatten::visitExpression(Expression *)");
  }
  IVar17 = (((SpecificExpression<(wasm::Expression::Id)9> *)
            &local_80->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression)._id;
  local_40 = local_80;
  if ((int)IVar17 < 3) {
    if (IVar17 == BlockId) {
      local_a0 = (_Rb_tree_node_base *)
                 &((this->
                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                   ).
                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                   .
                   super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                   .
                   super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                  .currModule)->allocator;
      auStack_b8 = (undefined1  [8])0x0;
      prelude = (Expression *)0x0;
      local_a8 = (_Base_ptr)0x0;
      pMVar35 = (MixedArena *)
                (local_80->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                data;
      if (pMVar35 == (MixedArena *)0x0) {
        auStack_b8 = (undefined1  [8])0x0;
        prelude._0_4_ = 0;
        prelude._4_4_ = 0;
        local_a8._0_4_ = 0;
        local_a8._4_4_ = 0;
      }
      else {
        pMVar39 = (MixedArena *)0x0;
        do {
          if ((MixedArena *)
              (local_40->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
              <= pMVar39) {
LAB_006ef1b6:
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          local_58 = *(Try **)(&local_40->body->_id + (long)pMVar39 * 2);
          iVar21 = std::
                   _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->preludes)._M_h,(key_type *)&local_58);
          if (iVar21.
              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            puVar37 = *(undefined8 **)
                       ((long)iVar21.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                              ._M_cur + 0x10);
            puVar5 = *(undefined8 **)
                      ((long)iVar21.
                             super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                             ._M_cur + 0x18);
            if (puVar37 != puVar5) {
              do {
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           auStack_b8,(Expression *)*puVar37);
                puVar37 = puVar37 + 1;
              } while (puVar37 != puVar5);
              if (*(long *)((long)iVar21.
                                  super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                  ._M_cur + 0x18) !=
                  *(long *)((long)iVar21.
                                  super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                  ._M_cur + 0x10)) {
                *(long *)((long)iVar21.
                                super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                ._M_cur + 0x18) =
                     *(long *)((long)iVar21.
                                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                     ._M_cur + 0x10);
              }
            }
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     auStack_b8,(Expression *)local_58);
          pMVar39 = (MixedArena *)
                    ((long)&(pMVar39->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1);
        } while (pMVar39 != pMVar35);
        this = local_48;
      }
      local_40->body = (Expression *)auStack_b8;
      *(undefined4 *)
       &(local_40->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
           prelude._0_4_;
      *(undefined4 *)
       ((long)&(local_40->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
       + 4) = prelude._4_4_;
      *(undefined4 *)
       &(local_40->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
        usedElements = (undefined4)local_a8;
      *(undefined4 *)
       ((long)&(local_40->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
               usedElements + 4) = local_a8._4_4_;
      auStack_b8 = (undefined1  [8])0x0;
      prelude = (Expression *)0x0;
      local_a8 = (_Base_ptr)0x0;
      uVar29 = (((SpecificExpression<(wasm::Expression::Id)9> *)
                &local_40->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression).
               type.id;
      if (1 < uVar29) {
        in_R8.id = (((ArenaVector<wasm::Name> *)&local_40->name)->
                   super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).usedElements;
        p_Var25 = std::
                  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_M_find_before_node
                            (&(this->breakTemps)._M_h,
                             in_R8.id % (this->breakTemps)._M_h._M_bucket_count,
                             (key_type *)&local_40->name,in_R8.id);
        if ((p_Var25 == (__node_base_ptr)0x0) || (p_Var25->_M_nxt == (_Hash_node_base *)0x0)) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar29;
          IVar17 = Builder::addVar((Builder *)
                                   (this->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .currFunction,(Function *)0x0,(Name)(auVar11 << 0x40),in_R8);
        }
        else {
          IVar17 = *(Id *)&p_Var25->_M_nxt[3]._M_nxt;
        }
        pMVar35 = (MixedArena *)
                  (local_40->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                  data;
        if (pMVar35 == (MixedArena *)0x0) {
          __assert_fail("usedElements > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xd0,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        pEVar23 = local_40->body;
        pEVar28 = *(Expression **)((long)pEVar23 + (long)pMVar35 * 8 + -8);
        if (1 < (pEVar28->type).id) {
          pLVar19 = Builder::makeLocalSet(&local_38,IVar17,pEVar28);
          *(LocalSet **)((long)pEVar23 + (long)pMVar35 * 8 + -8) = pLVar19;
        }
        Block::finalize((Block *)local_40,(Type)0x0);
        pEVar23 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar23->_id = LocalGetId;
        pEVar23[1]._id = IVar17;
        (pEVar23->type).id = uVar29;
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   item,pEVar23);
        ppEVar26 = SmallVector<wasm::Expression_*,_10UL>::back
                             (&(this->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .expressionStack);
        *ppEVar26 = pEVar23;
        local_58 = local_40;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                   (Expression **)&local_58);
      }
      Block::finalize((Block *)local_40,(Type)0x0);
      goto LAB_006eefb5;
    }
    if (IVar17 != IfId) {
LAB_006ef1f4:
      handle_unreachable("unexpected expr type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                         ,0xe5);
    }
    pTVar18 = (Try *)getPreludesWithExpression
                               (this,(Expression *)
                                     (((ArenaVector<wasm::Name> *)&local_80->name)->
                                     super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).
                                     data,(Expression *)local_80);
    uVar29 = (((SpecificExpression<(wasm::Expression::Id)9> *)
              &pTVar20->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression).type.
             id;
    pEVar23 = (Expression *)
              (((ArenaVector<wasm::Name> *)&pTVar20->name)->
              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).usedElements;
    pEVar28 = pTVar20->body;
    auStack_b8 = (undefined1  [8])0x0;
    pEVar22 = pEVar23;
    if (1 < uVar29) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar29;
      IVar15 = Builder::addVar((Builder *)
                               (local_48->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .currFunction,(Function *)0x0,(Name)(auVar6 << 0x40),in_R8);
      pEVar22 = (Expression *)
                (((ArenaVector<wasm::Name> *)&local_40->name)->
                super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).usedElements;
      if (1 < (pEVar22->type).id) {
        pLVar19 = Builder::makeLocalSet(&local_38,IVar15,pEVar22);
        (((ArenaVector<wasm::Name> *)&local_40->name)->
        super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).usedElements = (size_t)pLVar19;
      }
      pEVar22 = local_40->body;
      if ((pEVar22 != (Expression *)0x0) && (1 < (pEVar22->type).id)) {
        pLVar19 = Builder::makeLocalSet(&local_38,IVar15,pEVar22);
        local_40->body = (Expression *)pLVar19;
      }
      auStack_b8 = (undefined1  [8])pTVar18;
      pTVar18 = (Try *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      (((SpecificExpression<(wasm::Expression::Id)9> *)
       &pTVar18->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression)._id =
           LocalGetId;
      *(Index *)&(((ArenaVector<wasm::Name> *)&pTVar18->name)->
                 super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).data = IVar15;
      (((SpecificExpression<(wasm::Expression::Id)9> *)
       &pTVar18->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression).type.id =
           uVar29;
      pEVar22 = (Expression *)
                (((ArenaVector<wasm::Name> *)&local_40->name)->
                super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).usedElements;
    }
    pFVar34 = local_48;
    pEVar22 = getPreludesWithExpression(local_48,pEVar23,pEVar22);
    pEVar23 = item;
    (((ArenaVector<wasm::Name> *)&local_40->name)->
    super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).usedElements = (size_t)pEVar22;
    if (local_40->body != (Expression *)0x0) {
      pEVar28 = getPreludesWithExpression(pFVar34,pEVar28,local_40->body);
      local_40->body = pEVar28;
    }
    If::finalize((If *)local_40);
    if (auStack_b8 != (undefined1  [8])0x0) {
      Visitor<wasm::ReFinalizeNode,_void>::visit
                ((Visitor<wasm::ReFinalizeNode,_void> *)&local_58,(Expression *)auStack_b8);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&curr_local,
                 (value_type *)auStack_b8);
    }
    Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
              ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
               pEVar23,(Expression *)pTVar18);
  }
  else {
    if (IVar17 != LoopId) {
      if (IVar17 != TryId) goto LAB_006ef1f4;
      pEVar23 = local_80->body;
      pEVar1 = &local_80->catchBodies;
      in_R8.id = (local_80->catchBodies).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements;
      __first.index = 0;
      __first.parent = pEVar1;
      __last.index = in_R8.id;
      __last.parent = pEVar1;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      vector<ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::Iterator,void>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8,__first,
                 __last,(allocator_type *)&local_58);
      uVar29 = (((SpecificExpression<(wasm::Expression::Id)9> *)
                &pTVar20->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression).
               type.id;
      if (1 < uVar29) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar29;
        IVar15 = Builder::addVar((Builder *)
                                 (this->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .currFunction,(Function *)0x0,(Name)(auVar7 << 0x40),in_R8);
        if (1 < (local_40->body->type).id) {
          pLVar19 = Builder::makeLocalSet(&local_38,IVar15,local_40->body);
          local_40->body = (Expression *)pLVar19;
        }
        uVar31 = (local_40->catchBodies).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements;
        if (uVar31 != 0) {
          uVar33 = 1;
          uVar38 = 0;
          do {
            pEVar28 = *(Expression **)
                       (&((Expression *)
                         (pEVar1->
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
                         .data)->_id + uVar38 * 2);
            if (1 < (pEVar28->type).id) {
              pLVar19 = Builder::makeLocalSet(&local_38,IVar15,pEVar28);
              uVar31 = (local_40->catchBodies).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       usedElements;
              if (uVar31 <= uVar38) goto LAB_006ef1b6;
              *(LocalSet **)
               (&((Expression *)
                 (pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ).data)->_id + uVar38 * 2) = pLVar19;
            }
            uVar38 = (ulong)uVar33;
            uVar33 = uVar33 + 1;
          } while (uVar38 < uVar31);
        }
        pTVar20 = (Try *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        (((SpecificExpression<(wasm::Expression::Id)9> *)
         &pTVar20->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression)._id =
             LocalGetId;
        *(Index *)&(((ArenaVector<wasm::Name> *)&pTVar20->name)->
                   super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).data = IVar15;
        (((SpecificExpression<(wasm::Expression::Id)9> *)
         &pTVar20->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression).type.id =
             uVar29;
        local_58 = local_40;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                   (Expression **)&local_58);
        this = local_48;
      }
      pTVar18 = local_40;
      pEVar23 = getPreludesWithExpression(this,pEVar23,local_40->body);
      pTVar18->body = pEVar23;
      if ((pTVar18->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements !=
          0) {
        uVar33 = 1;
        uVar29 = 0;
        do {
          pEVar23 = getPreludesWithExpression
                              (this,*(Expression **)
                                     (&(((SpecificExpression<(wasm::Expression::Id)9> *)auStack_b8)
                                       ->super_Expression)._id + uVar29 * 2),
                               *(Expression **)
                                (&((Expression *)
                                  (pEVar1->
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  ).data)->_id + uVar29 * 2));
          uVar31 = (local_40->catchBodies).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                   usedElements;
          if (uVar31 <= uVar29) goto LAB_006ef1b6;
          *(Expression **)
           (&((Expression *)
             (pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
             data)->_id + uVar29 * 2) = pEVar23;
          uVar29 = (ulong)uVar33;
          uVar33 = uVar33 + 1;
        } while (uVar29 < uVar31);
      }
      Try::finalize(local_40);
      Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)item
                 ,(Expression *)pTVar20);
      ppEVar26 = SmallVector<wasm::Expression_*,_10UL>::back
                           (&(this->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             .expressionStack);
      *ppEVar26 = (Expression *)pTVar20;
      if (auStack_b8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_b8,(long)local_a8 - (long)auStack_b8);
      }
      goto LAB_006eefb5;
    }
    uVar29 = (((SpecificExpression<(wasm::Expression::Id)9> *)
              &local_80->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression).type
             .id;
    pEVar23 = local_80->body;
    pEVar28 = pEVar23;
    pTVar18 = local_80;
    if (1 < uVar29) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar29;
      IVar15 = Builder::addVar((Builder *)
                               (local_48->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .currFunction,(Function *)0x0,(Name)(auVar8 << 0x40),in_R8);
      pTVar20 = local_40;
      pLVar19 = Builder::makeLocalSet(&local_38,IVar15,local_40->body);
      pTVar20->body = (Expression *)pLVar19;
      pTVar18 = (Try *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      (((SpecificExpression<(wasm::Expression::Id)9> *)
       &pTVar18->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression)._id =
           LocalGetId;
      *(Index *)&(((ArenaVector<wasm::Name> *)&pTVar18->name)->
                 super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).data = IVar15;
      (((SpecificExpression<(wasm::Expression::Id)9> *)
       &pTVar18->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression).type.id =
           uVar29;
      auStack_b8 = (undefined1  [8])pTVar20;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                 (Expression **)auStack_b8);
      (((SpecificExpression<(wasm::Expression::Id)9> *)
       &pTVar20->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression).type.id = 0;
      pEVar28 = pTVar20->body;
    }
    pFVar34 = local_48;
    pEVar23 = getPreludesWithExpression(local_48,pEVar23,pEVar28);
    local_40->body = pEVar23;
    Loop::finalize((Loop *)local_40);
    Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
              ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)item,
               (Expression *)pTVar18);
  }
  ppEVar26 = SmallVector<wasm::Expression_*,_10UL>::back
                       (&(pFVar34->
                         super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                         ).
                         super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                         .expressionStack);
  *ppEVar26 = (Expression *)pTVar18;
LAB_006eefb5:
  pEVar23 = item;
  local_80 = (Try *)**(undefined8 **)item;
  Visitor<wasm::ReFinalizeNode,_void>::visit
            ((Visitor<wasm::ReFinalizeNode,_void> *)auStack_b8,(Expression *)local_80);
  pFVar34 = local_48;
  uVar29 = (local_80->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id;
  if (uVar29 != 0) {
    if (uVar29 == 1) {
      if (iStack_70._M_current == local_68) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                   iStack_70,(Expression **)&local_80);
      }
      else {
        *iStack_70._M_current = (Expression *)local_80;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      pEVar28 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x10,8);
      pEVar28->_id = UnreachableId;
      (pEVar28->type).id = 1;
      Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                 pEVar23,pEVar28);
    }
    else {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar29;
      IVar17 = Builder::addVar((Builder *)
                               (local_48->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .currFunction,(Function *)0x0,(Name)(auVar12 << 0x40),in_R8);
      auStack_b8 = (undefined1  [8])Builder::makeLocalSet(&local_38,IVar17,(Expression *)local_80);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                 (Expression **)auStack_b8);
      pEVar28 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar28->_id = LocalGetId;
      pEVar28[1]._id = IVar17;
      (pEVar28->type).id = uVar29;
      Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                 pEVar23,pEVar28);
    }
    ppEVar26 = SmallVector<wasm::Expression_*,_10UL>::back
                         (&(pFVar34->
                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                           ).
                           super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                           .expressionStack);
    *ppEVar26 = pEVar28;
  }
  if (curr_local != (Expression *)iStack_70._M_current) {
    auStack_b8 = (undefined1  [8])
                 ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                 ::getParent((ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              *)pEVar23);
    if ((auStack_b8 == (undefined1  [8])0x0) ||
       ((uVar29 = (ulong)(((SpecificExpression<(wasm::Expression::Id)9> *)
                          &((Try *)auStack_b8)->super_SpecificExpression<(wasm::Expression::Id)49>)
                         ->super_Expression)._id, uVar29 < 0x32 &&
        ((0x200000000000eU >> (uVar29 & 0x3f) & 1) != 0)))) {
      local_58 = (Try *)*(pFVar34->
                         super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                         ).
                         super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                         .
                         super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                         .
                         super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                         .replacep;
      pmVar30 = std::__detail::
                _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pFVar34->preludes,(key_type *)&local_58);
      pEVar23 = (Expression *)
                (pmVar30->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
      pEVar28 = (Expression *)
                (pmVar30->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_finish;
      ppEVar4 = (pmVar30->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage;
      (pmVar30->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_start = (pointer)curr_local;
      (pmVar30->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_finish = iStack_70._M_current;
      (pmVar30->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_68;
      curr_local = pEVar23;
      iStack_70._M_current = (Expression **)pEVar28;
      local_68 = ppEVar4;
    }
    else {
      this_00 = (vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                std::__detail::
                _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pFVar34->preludes,(key_type *)auStack_b8);
      iVar13._M_current = iStack_70._M_current;
      if (curr_local != (Expression *)iStack_70._M_current) {
        pEVar23 = curr_local;
        do {
          local_58 = *(Try **)pEVar23;
          __position._M_current = *(Expression ***)(this_00 + 8);
          if (__position._M_current == *(Expression ***)(this_00 + 0x10)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>(this_00,__position,(Expression **)&local_58);
          }
          else {
            *__position._M_current = (Expression *)local_58;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
          pEVar23 = (Expression *)&pEVar23->type;
        } while (pEVar23 != (Expression *)iVar13._M_current);
      }
    }
  }
  if (curr_local != (Expression *)0x0) {
    operator_delete(curr_local,(long)local_68 - (long)curr_local);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    std::vector<Expression*> ourPreludes;
    Builder builder(*getModule());

    // Nothing to do for constants and nop.
    if (Properties::isConstantExpression(curr) || curr->is<Nop>()) {
      return;
    }

    if (Properties::isControlFlowStructure(curr)) {
      // handle control flow explicitly. our children do not have control flow,
      // but they do have preludes which we need to set up in the right place

      // no one should have given us preludes, they are on the children
      assert(preludes.find(curr) == preludes.end());

      if (auto* block = curr->dynCast<Block>()) {
        // make a new list, where each item's preludes are added before it
        ExpressionList newList(getModule()->allocator);
        for (auto* item : block->list) {
          auto iter = preludes.find(item);
          if (iter != preludes.end()) {
            auto& itemPreludes = iter->second;
            for (auto* prelude : itemPreludes) {
              newList.push_back(prelude);
            }
            itemPreludes.clear();
          }
          newList.push_back(item);
        }
        block->list.swap(newList);
        // remove a block return value
        auto type = block->type;
        if (type.isConcrete()) {
          // if there is a temp index for breaking to the block, use that
          Index temp;
          auto iter = breakTemps.find(block->name);
          if (iter != breakTemps.end()) {
            temp = iter->second;
          } else {
            temp = builder.addVar(getFunction(), type);
          }
          auto*& last = block->list.back();
          if (last->type.isConcrete()) {
            last = builder.makeLocalSet(temp, last);
          }
          block->finalize(Type::none);
          // and we leave just a get of the value
          auto* rep = builder.makeLocalGet(temp, type);
          replaceCurrent(rep);
          // the whole block is now a prelude
          ourPreludes.push_back(block);
        }
        // the block now has no return value, and may have become unreachable
        block->finalize(Type::none);

      } else if (auto* iff = curr->dynCast<If>()) {
        // condition preludes go before the entire if
        auto* rep = getPreludesWithExpression(iff->condition, iff);
        // arm preludes go in the arms. we must also remove an if value
        auto* originalIfTrue = iff->ifTrue;
        auto* originalIfFalse = iff->ifFalse;
        auto type = iff->type;
        Expression* prelude = nullptr;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (iff->ifTrue->type.isConcrete()) {
            iff->ifTrue = builder.makeLocalSet(temp, iff->ifTrue);
          }
          if (iff->ifFalse && iff->ifFalse->type.isConcrete()) {
            iff->ifFalse = builder.makeLocalSet(temp, iff->ifFalse);
          }
          // the whole if (+any preludes from the condition) is now a prelude
          prelude = rep;
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
        }
        iff->ifTrue = getPreludesWithExpression(originalIfTrue, iff->ifTrue);
        if (iff->ifFalse) {
          iff->ifFalse =
            getPreludesWithExpression(originalIfFalse, iff->ifFalse);
        }
        iff->finalize();
        if (prelude) {
          ReFinalizeNode().visit(prelude);
          ourPreludes.push_back(prelude);
        }
        replaceCurrent(rep);

      } else if (auto* loop = curr->dynCast<Loop>()) {
        // remove a loop value
        Expression* rep = loop;
        auto* originalBody = loop->body;
        auto type = loop->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          loop->body = builder.makeLocalSet(temp, loop->body);
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole if is now a prelude
          ourPreludes.push_back(loop);
          loop->type = Type::none;
        }
        loop->body = getPreludesWithExpression(originalBody, loop->body);
        loop->finalize();
        replaceCurrent(rep);

      } else if (auto* tryy = curr->dynCast<Try>()) {
        // remove a try value
        Expression* rep = tryy;
        auto* originalBody = tryy->body;
        std::vector<Expression*> originalCatchBodies(tryy->catchBodies.begin(),
                                                     tryy->catchBodies.end());
        auto type = tryy->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (tryy->body->type.isConcrete()) {
            tryy->body = builder.makeLocalSet(temp, tryy->body);
          }
          for (Index i = 0; i < tryy->catchBodies.size(); i++) {
            if (tryy->catchBodies[i]->type.isConcrete()) {
              tryy->catchBodies[i] =
                builder.makeLocalSet(temp, tryy->catchBodies[i]);
            }
          }
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole try is now a prelude
          ourPreludes.push_back(tryy);
        }
        tryy->body = getPreludesWithExpression(originalBody, tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = getPreludesWithExpression(
            originalCatchBodies[i], tryy->catchBodies[i]);
        }
        tryy->finalize();
        replaceCurrent(rep);

      } else {
        WASM_UNREACHABLE("unexpected expr type");
      }

    } else {
      // for anything else, there may be existing preludes
      auto iter = preludes.find(curr);
      if (iter != preludes.end()) {
        ourPreludes.swap(iter->second);
      }

      // special handling
      if (auto* set = curr->dynCast<LocalSet>()) {
        if (set->isTee()) {
          // we disallow local.tee
          if (set->value->type == Type::unreachable) {
            replaceCurrent(set->value); // trivial, no set happens
          } else {
            // use a set in a prelude + a get
            set->makeSet();
            ourPreludes.push_back(set);
            Type localType = getFunction()->getLocalType(set->index);
            replaceCurrent(builder.makeLocalGet(set->index, localType));
          }
        }

      } else if (auto* br = curr->dynCast<Break>()) {
        if (br->value) {
          auto type = br->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Type blockType = findBreakTarget(br->name)->type;
            Index temp = getTempForBreakTarget(br->name, blockType);
            ourPreludes.push_back(builder.makeLocalSet(temp, br->value));

            // br_if leaves a value on the stack if not taken, which later can
            // be the last element of the enclosing innermost block and flow
            // out. The local we created using 'getTempForBreakTarget' returns
            // the return type of the block this branch is targetting, which may
            // not be the same with the innermost block's return type. For
            // example,
            // (block $any (result anyref)
            //   (block (result funcref)
            //     (local.tee $0
            //       (br_if $any
            //         (ref.null func)
            //         (i32.const 0)
            //       )
            //     )
            //   )
            // )
            // In this case we need two locals to store (ref.null); one with
            // funcref type that's for the target block ($label0) and one more
            // with anyref type in case for flowing out. Here we create the
            // second 'flowing out' local in case two block's types are
            // different.
            if (type != blockType) {
              temp = builder.addVar(getFunction(), type);
              ourPreludes.push_back(builder.makeLocalSet(
                temp, ExpressionManipulator::copy(br->value, *getModule())));
            }

            if (br->condition) {
              // the value must also flow out
              ourPreludes.push_back(br);
              if (br->type.isConcrete()) {
                replaceCurrent(builder.makeLocalGet(temp, type));
              } else {
                assert(br->type == Type::unreachable);
                replaceCurrent(builder.makeUnreachable());
              }
            }
            br->value = nullptr;
            br->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(br->value);
          }
        }

      } else if (auto* sw = curr->dynCast<Switch>()) {
        if (sw->value) {
          auto type = sw->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Index temp = builder.addVar(getFunction(), type);
            ourPreludes.push_back(builder.makeLocalSet(temp, sw->value));
            // we don't know which break target will be hit - assign to them all
            auto names = BranchUtils::getUniqueTargets(sw);
            for (auto name : names) {
              ourPreludes.push_back(
                builder.makeLocalSet(getTempForBreakTarget(name, type),
                                     builder.makeLocalGet(temp, type)));
            }
            sw->value = nullptr;
            sw->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(sw->value);
          }
        }
      }
    }

    // continue for general handling of everything, control flow or otherwise
    curr = getCurrent(); // we may have replaced it
    // we have changed children
    ReFinalizeNode().visit(curr);
    if (curr->type == Type::unreachable) {
      ourPreludes.push_back(curr);
      replaceCurrent(builder.makeUnreachable());
    } else if (curr->type.isConcrete()) {
      // use a local
      auto type = curr->type;
      Index temp = builder.addVar(getFunction(), type);
      ourPreludes.push_back(builder.makeLocalSet(temp, curr));
      replaceCurrent(builder.makeLocalGet(temp, type));
    }

    // next, finish up: migrate our preludes if we can
    if (!ourPreludes.empty()) {
      auto* parent = getParent();
      if (parent && !Properties::isControlFlowStructure(parent)) {
        auto& parentPreludes = preludes[parent];
        for (auto* prelude : ourPreludes) {
          parentPreludes.push_back(prelude);
        }
      } else {
        // keep our preludes, parent will handle them
        preludes[getCurrent()].swap(ourPreludes);
      }
    }
  }